

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O0

void __thiscall
luna::Library::RegisterToTable(Library *this,Table *table,TableMemberReg *table_reg,size_t size)

{
  int iVar1;
  ulong in_RCX;
  CFunctionType in_RDX;
  char *in_RSI;
  Table *in_RDI;
  Library *unaff_retaddr;
  size_t i;
  ulong local_28;
  
  for (local_28 = 0; local_28 < in_RCX; local_28 = local_28 + 1) {
    iVar1 = *(int *)(in_RDX + local_28 * 0x18 + 0x10);
    if (iVar1 == 2) {
      RegisterNumber(unaff_retaddr,in_RDI,in_RSI,(double)in_RDX);
    }
    else if (iVar1 == 4) {
      RegisterString(unaff_retaddr,in_RDI,in_RSI,(char *)in_RDX);
    }
    else if (iVar1 == 9) {
      RegisterFunc(unaff_retaddr,in_RDI,in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void Library::RegisterToTable(Table *table, const TableMemberReg *table_reg,
                                  std::size_t size)
    {
        for (std::size_t i = 0; i < size; ++i)
        {
            switch (table_reg[i].type_)
            {
                case ValueT_CFunction:
                    RegisterFunc(table, table_reg[i].name_, table_reg[i].func_);
                    break;
                case ValueT_Number:
                    RegisterNumber(table, table_reg[i].name_, table_reg[i].number_);
                    break;
                case ValueT_String:
                    RegisterString(table, table_reg[i].name_, table_reg[i].str_);
                    break;
                default: break;
            }
        }
    }